

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

string * __thiscall Json::Value::asString_abi_cxx11_(string *__return_storage_ptr__,Value *this)

{
  uint uVar1;
  char *__s;
  uint *__s_00;
  ostringstream oss;
  string sStack_1a8;
  allocator<char> local_188 [376];
  size_t sVar2;
  
  switch((char)*(ushort *)&this->field_0x8) {
  case '\x01':
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x44cfd0);
    break;
  case '\x02':
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)(this->value_).map_,0x44cfd0);
    break;
  case '\x03':
    valueToString_abi_cxx11_(__return_storage_ptr__,(Json *)this,(this->value_).real_);
    break;
  case '\x04':
    __s_00 = (uint *)(this->value_).string_;
    if (__s_00 != (uint *)0x0) {
      if ((*(ushort *)&this->field_0x8 >> 8 & 1) == 0) {
        sVar2 = strlen((char *)__s_00);
        uVar1 = (uint)sVar2;
      }
      else {
        uVar1 = *__s_00;
        __s_00 = __s_00 + 1;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,__s_00,(char *)((ulong)uVar1 + (long)__s_00));
      return __return_storage_ptr__;
    }
  case '\0':
    __s = "";
    goto LAB_003cbde4;
  case '\x05':
    __s = "false";
    if ((this->value_).bool_ != false) {
      __s = "true";
    }
LAB_003cbde4:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_188);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::operator<<((ostream *)local_188,"Type is not convertible to string");
    std::__cxx11::stringbuf::str();
    throwLogicError(&sStack_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

JSONCPP_STRING Value::asString() const {
  switch (type_) {
  case nullValue:
    return "";
  case stringValue:
  {
    if (value_.string_ == 0) return "";
    unsigned this_len;
    char const* this_str;
    decodePrefixedString(this->allocated_, this->value_.string_, &this_len, &this_str);
    return JSONCPP_STRING(this_str, this_len);
  }
  case booleanValue:
    return value_.bool_ ? "true" : "false";
  case intValue:
    return valueToString(value_.int_);
  case uintValue:
    return valueToString(value_.uint_);
  case realValue:
    return valueToString(value_.real_);
  default:
    JSON_FAIL_MESSAGE("Type is not convertible to string");
  }
}